

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::Remove(SQVM *this,SQInteger n)

{
  SQObjectPtr *pSVar1;
  long lVar2;
  long lVar3;
  
  if (n < 0) {
    lVar2 = n + this->_top;
  }
  else {
    lVar2 = n + this->_stackbase + -1;
  }
  lVar3 = lVar2 << 4;
  for (; lVar2 < this->_top; lVar2 = lVar2 + 1) {
    pSVar1 = (this->_stack)._vals;
    SQObjectPtr::operator=
              ((SQObjectPtr *)((long)&(pSVar1->super_SQObject)._type + lVar3),
               (SQObjectPtr *)((long)&pSVar1[1].super_SQObject._type + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  SQObjectPtr::Null((this->_stack)._vals + this->_top);
  this->_top = this->_top + -1;
  return;
}

Assistant:

void SQVM::Remove(SQInteger n) {
    n = (n >= 0)?n + _stackbase - 1:_top + n;
    for(SQInteger i = n; i < _top; i++){
        _stack[i] = _stack[i+1];
    }
    _stack[_top].Null();
    _top--;
}